

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gsl.hpp
# Opt level: O0

span<int,__1L> __thiscall pstore::gsl::span<int,_-1L>::first(span<int,__1L> *this,index_type count)

{
  index_type iVar1;
  pointer ptr;
  index_type count_local;
  span<int,__1L> *this_local;
  
  if (-1 < count) {
    iVar1 = size(this);
    if (count <= iVar1) {
      ptr = data(this);
      span((span<int,__1L> *)&this_local,ptr,count);
      return (span<int,__1L>)_this_local;
    }
  }
  assert_failed("count >= 0 && count <= size ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/gsl.hpp"
                ,0x15f);
}

Assistant:

span<element_type, dynamic_extent> first (index_type count) const {
                PSTORE_ASSERT (count >= 0 && count <= size ());
                return {data (), count};
            }